

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O3

void * sndio_mainloop(void *arg)

{
  pthread_mutex_t *__mutex;
  float fVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  pollfd *__fds;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  bool bVar15;
  short *psVar16;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  ulong local_40;
  
  iVar4 = (*cubeb_sio_nfds)(*(sio_hdl **)((long)arg + 0x40));
  __fds = (pollfd *)calloc((long)iVar4,8);
  if (__fds != (pollfd *)0x0) {
    (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),0);
    __mutex = (pthread_mutex_t *)((long)arg + 0x18);
    pthread_mutex_lock(__mutex);
    iVar4 = (*cubeb_sio_start)(*(sio_hdl **)((long)arg + 0x40));
    if (iVar4 == 0) {
      pthread_mutex_unlock(__mutex);
    }
    else {
      iVar4 = *(int *)((long)arg + 0x68);
      if ((*(uint *)((long)arg + 0x48) & 1) == 0) {
        iVar11 = 0;
        uVar5 = 0;
        uVar14 = 0;
        uVar18 = (ulong)(uint)(iVar4 * *(int *)((long)arg + 0x6c));
      }
      else {
        uVar5 = *(int *)((long)arg + 0x70) * iVar4;
        iVar11 = *(int *)((long)arg + 0x7c);
        if ((*(uint *)((long)arg + 0x48) & 2) == 0) {
          uVar14 = 0;
          uVar18 = 0;
        }
        else {
          memset(*(void **)((long)arg + 0x58),0,(ulong)(uint)(iVar4 * *(int *)((long)arg + 0x6c)));
          uVar14 = (ulong)(uint)(*(int *)((long)arg + 0x6c) * *(int *)((long)arg + 0x68));
          uVar18 = uVar14;
        }
      }
      if (*(int *)((long)arg + 0x4c) != 0) {
        uVar12 = (ulong)uVar5;
        bVar3 = false;
        local_40 = uVar12;
        do {
          uVar5 = *(uint *)((long)arg + 0x48) & 2;
          uVar10 = *(uint *)((long)arg + 0x48) & 1;
          if (((uVar10 == 0) || (uVar9 = 1, uVar12 == local_40)) &&
             ((uVar5 == 0 || (uVar9 = uVar10, uVar14 == uVar18)))) {
            uVar13 = 2;
            if (bVar3) goto LAB_0011e8e5;
            if (((uVar5 != 0) && (*(int *)((long)arg + 0x50) != 0)) &&
               (uVar5 = *(int *)((long)arg + 0x74) * *(int *)((long)arg + 0x68), uVar5 != 0)) {
              lVar17 = *(long *)((long)arg + 0x58);
              uVar7 = (ulong)uVar5 + 1;
              do {
                *(float *)(lVar17 + -8 + uVar7 * 4) =
                     (float)*(int *)(lVar17 + -8 + uVar7 * 4) * 1.1920929e-07;
                uVar7 = uVar7 - 1;
              } while (1 < uVar7);
            }
            pthread_mutex_unlock(__mutex);
            uVar7 = (**(code **)((long)arg + 0x90))
                              (arg,*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x58),
                               *(undefined8 *)((long)arg + 0x60),*(undefined4 *)((long)arg + 0x68));
            pthread_mutex_lock(__mutex);
            if ((long)uVar7 < 0) {
              uVar13 = 3;
              goto LAB_0011e8e5;
            }
            *(long *)((long)arg + 0x88) = *(long *)((long)arg + 0x88) + uVar7;
            uVar5 = *(uint *)((long)arg + 0x48);
            if (uVar7 < *(uint *)((long)arg + 0x68)) {
              if (((uVar5 & 1) == 0) || (uVar7 == 0)) goto LAB_0011e8e5;
              local_40 = *(uint *)((long)arg + 0x70) * uVar7;
              iVar11 = iVar11 - (uint)(0 < iVar11);
              bVar3 = true;
LAB_0011e653:
              lVar17 = uVar7 * *(uint *)((long)arg + 0x78);
              fVar1 = *(float *)((long)arg + 0xa0);
              if (*(int *)((long)arg + 0x50) == 0) {
                uVar9 = 1;
                if (lVar17 != 0) {
                  psVar16 = *(short **)((long)arg + 0x60);
                  uVar7 = lVar17 + 1;
                  do {
                    *psVar16 = (short)((uint)((int)*psVar16 * (int)(fVar1 * 32768.0)) >> 0xf);
                    psVar16 = psVar16 + 1;
                    uVar7 = uVar7 - 1;
                  } while (1 < uVar7);
                }
              }
              else if (lVar17 == 0) {
                uVar9 = 1;
              }
              else {
                pfVar19 = *(float **)((long)arg + 0x60);
                uVar7 = lVar17 + 1;
                do {
                  lVar17 = lrintf(*pfVar19 * fVar1 * 8388608.0);
                  fVar6 = (float)lVar17;
                  if (0x7ffffe < (int)fVar6) {
                    fVar6 = 1.1754942e-38;
                  }
                  if ((int)fVar6 < -0x7fffff) {
                    fVar6 = -INFINITY;
                  }
                  *pfVar19 = fVar6;
                  pfVar19 = pfVar19 + 1;
                  uVar7 = uVar7 - 1;
                } while (1 < uVar7);
                uVar5 = *(uint *)((long)arg + 0x48);
                uVar9 = uVar5 & 1;
              }
            }
            else {
              iVar11 = iVar11 - (uint)(0 < iVar11);
              bVar3 = false;
              if ((uVar5 & 1) != 0) goto LAB_0011e653;
              uVar9 = 0;
            }
            uVar5 = uVar5 & 2;
            if (uVar5 != 0) {
              uVar14 = 0;
            }
            if (uVar9 != 0) {
              uVar12 = 0;
            }
          }
          bVar15 = (iVar11 == 0 && (uVar14 <= uVar18 && uVar18 - uVar14 != 0)) && uVar5 != 0;
          cVar2 = bVar15 + '\x04';
          if (local_40 < uVar12 || local_40 - uVar12 == 0) {
            cVar2 = bVar15;
          }
          if (uVar9 == 0) {
            cVar2 = bVar15;
          }
          uVar5 = (*cubeb_sio_pollfd)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds,(int)cVar2);
          if ((int)uVar5 < 1) {
LAB_0011e7b1:
            uVar5 = (*cubeb_sio_revents)(*(sio_hdl **)((long)arg + 0x40),(pollfd *)__fds);
            uVar13 = 3;
            if ((uVar5 & 0x10) != 0) goto LAB_0011e8e5;
            if ((uVar5 & 4) != 0) {
              sVar8 = (*cubeb_sio_write)(*(sio_hdl **)((long)arg + 0x40),
                                         (void *)(*(long *)((long)arg + 0x60) + uVar12),
                                         local_40 - uVar12);
              if (((int)sVar8 == 0) &&
                 (iVar4 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar4 != 0))
              goto LAB_0011e8e5;
              uVar12 = uVar12 + (long)(int)sVar8;
            }
            if ((uVar5 & 1) != 0) {
              sVar8 = (*cubeb_sio_read)(*(sio_hdl **)((long)arg + 0x40),
                                        (void *)(*(long *)((long)arg + 0x58) + uVar14),
                                        uVar18 - uVar14);
              if (((int)sVar8 == 0) &&
                 (iVar4 = (*cubeb_sio_eof)(*(sio_hdl **)((long)arg + 0x40)), iVar4 != 0))
              goto LAB_0011e8e5;
              uVar14 = uVar14 + (long)(int)sVar8;
            }
            if ((0 < iVar11) && ((*(byte *)((long)arg + 0x48) & 2) != 0)) {
              uVar14 = uVar18;
            }
          }
          else {
            pthread_mutex_unlock(__mutex);
            iVar4 = poll(__fds,(ulong)uVar5,-1);
            pthread_mutex_lock(__mutex);
            if (-1 < iVar4) goto LAB_0011e7b1;
          }
        } while (*(int *)((long)arg + 0x4c) != 0);
      }
      uVar13 = 1;
LAB_0011e8e5:
      (*cubeb_sio_stop)(*(sio_hdl **)((long)arg + 0x40));
      *(undefined8 *)((long)arg + 0x80) = *(undefined8 *)((long)arg + 0x88);
      pthread_mutex_unlock(__mutex);
      (**(code **)((long)arg + 0x98))(arg,*(undefined8 *)((long)arg + 8),uVar13);
    }
    free(__fds);
  }
  return (void *)0x0;
}

Assistant:

static void *
sndio_mainloop(void * arg)
{
  struct pollfd * pfds;
  cubeb_stream * s = arg;
  int n, eof = 0, prime, nfds, events, revents, state = CUBEB_STATE_STARTED;
  size_t pstart = 0, pend = 0, rstart = 0, rend = 0;
  long nfr;

  CUBEB_REGISTER_THREAD("cubeb rendering thread");

  nfds = WRAP(sio_nfds)(s->hdl);
  pfds = calloc(nfds, sizeof(struct pollfd));
  if (pfds == NULL) {
    CUBEB_UNREGISTER_THREAD();
    return NULL;
  }

  DPR("sndio_mainloop()\n");
  s->state_cb(s, s->arg, CUBEB_STATE_STARTED);
  pthread_mutex_lock(&s->mtx);
  if (!WRAP(sio_start)(s->hdl)) {
    pthread_mutex_unlock(&s->mtx);
    free(pfds);
    CUBEB_UNREGISTER_THREAD();
    return NULL;
  }
  DPR("sndio_mainloop(), started\n");

  if (s->mode & SIO_PLAY) {
    pstart = pend = s->nfr * s->pbpf;
    prime = s->nblks;
    if (s->mode & SIO_REC) {
      memset(s->rbuf, 0, s->nfr * s->rbpf);
      rstart = rend = s->nfr * s->rbpf;
    }
  } else {
    prime = 0;
    rstart = 0;
    rend = s->nfr * s->rbpf;
  }

  for (;;) {
    if (!s->active) {
      DPR("sndio_mainloop() stopped\n");
      state = CUBEB_STATE_STOPPED;
      break;
    }

    /* do we have a complete block? */
    if ((!(s->mode & SIO_PLAY) || pstart == pend) &&
        (!(s->mode & SIO_REC) || rstart == rend)) {

      if (eof) {
        DPR("sndio_mainloop() drained\n");
        state = CUBEB_STATE_DRAINED;
        break;
      }

      if ((s->mode & SIO_REC) && s->conv)
        s24_to_float(s->rbuf, s->nfr * s->rchan);

      /* invoke call-back, it returns less that s->nfr if done */
      pthread_mutex_unlock(&s->mtx);
      nfr = s->data_cb(s, s->arg, s->rbuf, s->pbuf, s->nfr);
      pthread_mutex_lock(&s->mtx);
      if (nfr < 0) {
        DPR("sndio_mainloop() cb err\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      s->swpos += nfr;

      /* was this last call-back invocation (aka end-of-stream) ? */
      if (nfr < s->nfr) {

        if (!(s->mode & SIO_PLAY) || nfr == 0) {
          state = CUBEB_STATE_DRAINED;
          break;
        }

        /* need to write (aka drain) the partial play block we got */
        pend = nfr * s->pbpf;
        eof = 1;
      }

      if (prime > 0)
        prime--;

      if (s->mode & SIO_PLAY) {
        if (s->conv)
          float_to_s24(s->pbuf, nfr * s->pchan, s->volume);
        else
          s16_setvol(s->pbuf, nfr * s->pchan, s->volume);
      }

      if (s->mode & SIO_REC)
        rstart = 0;
      if (s->mode & SIO_PLAY)
        pstart = 0;
    }

    events = 0;
    if ((s->mode & SIO_REC) && rstart < rend && prime == 0)
      events |= POLLIN;
    if ((s->mode & SIO_PLAY) && pstart < pend)
      events |= POLLOUT;
    nfds = WRAP(sio_pollfd)(s->hdl, pfds, events);

    if (nfds > 0) {
      pthread_mutex_unlock(&s->mtx);
      n = poll(pfds, nfds, -1);
      pthread_mutex_lock(&s->mtx);
      if (n < 0)
        continue;
    }

    revents = WRAP(sio_revents)(s->hdl, pfds);

    if (revents & POLLHUP) {
      state = CUBEB_STATE_ERROR;
      break;
    }

    if (revents & POLLOUT) {
      n = WRAP(sio_write)(s->hdl, s->pbuf + pstart, pend - pstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() werr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      pstart += n;
    }

    if (revents & POLLIN) {
      n = WRAP(sio_read)(s->hdl, s->rbuf + rstart, rend - rstart);
      if (n == 0 && WRAP(sio_eof)(s->hdl)) {
        DPR("sndio_mainloop() rerr\n");
        state = CUBEB_STATE_ERROR;
        break;
      }
      rstart += n;
    }

    /* skip rec block, if not recording (yet) */
    if (prime > 0 && (s->mode & SIO_REC))
      rstart = rend;
  }
  WRAP(sio_stop)(s->hdl);
  s->hwpos = s->swpos;
  pthread_mutex_unlock(&s->mtx);
  s->state_cb(s, s->arg, state);
  free(pfds);
  CUBEB_UNREGISTER_THREAD();
  return NULL;
}